

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *this,ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  
  this->numActive = 0;
  this->numAllocated = 8;
  uVar9 = other->numAllocated;
  if (8 < uVar9) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar9;
    other->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other->space
    ;
    other->numAllocated = 8;
    other->numActive = 0;
    return;
  }
  this->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->space;
  sVar3 = other->numActive;
  this->numActive = sVar3;
  if (sVar3 != 0) {
    lVar8 = 0x10;
    uVar9 = 0;
    do {
      pbVar4 = this->items;
      puVar1 = (undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8);
      pbVar5 = other->items;
      puVar2 = (undefined8 *)((long)&(pbVar5->_M_dataplus)._M_p + lVar8);
      *(undefined8 **)((long)pbVar4 + lVar8 + -0x10) = puVar1;
      puVar6 = *(undefined8 **)((long)pbVar5 + lVar8 + -0x10);
      if (puVar2 == puVar6) {
        uVar7 = puVar2[1];
        *puVar1 = *puVar2;
        puVar1[1] = uVar7;
      }
      else {
        *(undefined8 **)((long)pbVar4 + lVar8 + -0x10) = puVar6;
        *(undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8) = *puVar2;
      }
      *(undefined8 *)((long)pbVar4 + lVar8 + -8) = *(undefined8 *)((long)pbVar5 + lVar8 + -8);
      *(undefined8 **)((long)pbVar5 + lVar8 + -0x10) = puVar2;
      *(undefined8 *)((long)pbVar5 + lVar8 + -8) = 0;
      *(undefined1 *)((long)&(pbVar5->_M_dataplus)._M_p + lVar8) = 0;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < this->numActive);
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }